

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_lock.hpp
# Opt level: O0

void __thiscall unodb::optimistic_lock::version_type::dump(version_type *this,ostream *os)

{
  _Setfill<char> _Var1;
  bool bVar2;
  _Setw _Var3;
  ostream *poVar4;
  undefined8 uVar5;
  void *this_00;
  ostream *os_local;
  version_type *this_local;
  
  poVar4 = std::operator<<(os,"version = 0x");
  uVar5 = std::ostream::operator<<(poVar4,std::hex);
  _Var1 = std::setfill<char>('0');
  poVar4 = std::operator<<(uVar5,_Var1._M_c);
  _Var3 = std::setw(8);
  poVar4 = std::operator<<(poVar4,_Var3);
  this_00 = (void *)std::ostream::operator<<(poVar4,this->version);
  std::ostream::operator<<(this_00,std::dec);
  bVar2 = is_write_locked(this);
  if (bVar2) {
    std::operator<<(os," (write locked)");
  }
  if (this->version == 1) {
    std::operator<<(os," (obsoleted)");
  }
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream &os) const {
      os << "version = 0x" << std::hex << std::setfill('0') << std::setw(8)
         << version << std::dec;
      if (is_write_locked()) os << " (write locked)";
      if (is_obsolete()) os << " (obsoleted)";
    }